

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_coop_mat_fp16_to_fp8
          (Impl *this,SPIRVModule *module,Id *ids,uint32_t id_count)

{
  Builder *this_00;
  Id pointee;
  Block *elseBlock;
  Impl *pIVar1;
  Id IVar2;
  Id typeId;
  Id typeId_00;
  Id id;
  Id IVar3;
  pointer pCVar4;
  Function *pFVar5;
  Block *pBVar6;
  Instruction *pIVar7;
  Instruction *this_01;
  Instruction *pIVar8;
  Instruction *pIVar9;
  Instruction *this_02;
  Id IVar10;
  Id local_cc;
  Instruction *local_c8;
  Instruction *local_c0;
  Instruction *local_b8;
  Instruction *local_b0;
  Block *local_a8;
  Function *local_a0;
  Block *local_98;
  Impl *local_90;
  Instruction *local_88;
  Block *local_80;
  Vector<CoopMatConvOp> *local_78;
  Block *entry;
  CoopMatConvOp local_68;
  undefined8 local_58;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_48;
  
  IVar3 = 0;
  if (id_count == 2) {
    IVar3 = *ids;
    pointee = ids[1];
    local_78 = &this->coop_mat_conv_ids;
    for (pCVar4 = (this->coop_mat_conv_ids).
                  super__Vector_base<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar4 != (this->coop_mat_conv_ids).
                  super__Vector_base<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pCVar4 = pCVar4 + 1) {
      if (((pCVar4->output_type == IVar3) && (pCVar4->input_type == pointee)) &&
         (pCVar4->call == CoopMatFP16toFP8)) {
        return pCVar4->func_id;
      }
    }
    this_00 = &this->builder;
    local_80 = (this->builder).buildPoint;
    entry = (Block *)0x0;
    IVar2 = spv::Builder::makeUintType(this_00,0x20);
    typeId = spv::Builder::makeBoolType(this_00);
    typeId_00 = spv::Builder::makeIntType(this_00,0x10);
    local_cc = spv::Builder::makePointer(this_00,StorageClassFunction,pointee);
    local_68.input_type = 0;
    local_68.output_type = 0;
    local_68.func_id = 0;
    local_68.call = DescriptorQACheck;
    local_58 = 0;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_68,
               &local_cc);
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pFVar5 = spv::Builder::makeFunctionEntry
                       (this_00,DecorationMax,IVar3,"CoopMatFP16toFP8",(Vector<Id> *)&local_68,
                        &local_48,&entry);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector(&local_48);
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
               &local_68);
    id = create_variable(this,StorageClassFunction,IVar3,"coop_output");
    local_88 = spv::Builder::addInstruction(this_00,IVar2,OpCooperativeMatrixLengthKHR);
    spv::Instruction::addIdOperand(local_88,IVar3);
    pBVar6 = (Block *)allocate_in_thread(0x78);
    IVar10 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar10;
    spv::Block::Block(pBVar6,IVar10,pFVar5);
    local_98 = (Block *)allocate_in_thread(0x78);
    IVar10 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar10;
    local_a0 = pFVar5;
    local_90 = this;
    spv::Block::Block(local_98,IVar10,pFVar5);
    spv::Builder::createBranch(this_00,pBVar6);
    (this->builder).buildPoint = pBVar6;
    local_a8 = pBVar6;
    pIVar7 = spv::Builder::addInstruction(this_00,IVar2,OpPhi);
    this_01 = spv::Builder::addInstruction(this_00,IVar2,OpIAdd);
    spv::Instruction::addIdOperand(this_01,pIVar7->resultId);
    IVar2 = spv::Builder::makeUintConstant(this_00,1,false);
    spv::Instruction::addIdOperand(this_01,IVar2);
    IVar2 = spv::Builder::makeUintConstant(this_00,0,false);
    spv::Instruction::addIdOperand(pIVar7,IVar2);
    spv::Instruction::addIdOperand
              (pIVar7,*(Id *)((long)(((entry->instructions).
                                      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                    ._M_t + 8));
    spv::Instruction::addIdOperand(pIVar7,this_01->resultId);
    local_b0 = pIVar7;
    spv::Instruction::addIdOperand
              (pIVar7,*(Id *)((long)(((pBVar6->instructions).
                                      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                    ._M_t + 8));
    IVar2 = spv::Builder::makeFloatType(this_00,0x10);
    IVar2 = spv::Builder::makePointer(this_00,StorageClassFunction,IVar2);
    pIVar8 = spv::Builder::addInstruction(this_00,IVar2,OpInBoundsAccessChain);
    spv::Instruction::addIdOperand
              (pIVar8,(*(pFVar5->parameterInstructions).
                        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_start)->resultId);
    spv::Instruction::addIdOperand(pIVar8,pIVar7->resultId);
    IVar2 = spv::Builder::makeFloatType(this_00,0x10);
    pIVar7 = spv::Builder::addInstruction(this_00,IVar2,OpLoad);
    spv::Instruction::addIdOperand(pIVar7,pIVar8->resultId);
    IVar2 = spv::Builder::import(this_00,"GLSL.std.450");
    IVar10 = spv::Builder::makeFloatType(this_00,0x10);
    pIVar8 = spv::Builder::addInstruction(this_00,IVar10,OpExtInst);
    spv::Instruction::addIdOperand(pIVar8,IVar2);
    spv::Instruction::addImmediateOperand(pIVar8,0x51);
    spv::Instruction::addIdOperand(pIVar8,pIVar7->resultId);
    IVar10 = spv::Builder::makeFloat16Constant(this_00,0xdf00,false);
    spv::Instruction::addIdOperand(pIVar8,IVar10);
    IVar10 = spv::Builder::makeFloat16Constant(this_00,0x5f00,false);
    spv::Instruction::addIdOperand(pIVar8,IVar10);
    pIVar7 = spv::Builder::addInstruction(this_00,typeId_00,OpBitcast);
    spv::Instruction::addIdOperand(pIVar7,pIVar8->resultId);
    IVar10 = spv::Builder::makeUintType(this_00,8);
    IVar10 = spv::Builder::makeVectorType(this_00,IVar10,2);
    pIVar8 = spv::Builder::addInstruction(this_00,IVar10,OpBitcast);
    spv::Instruction::addIdOperand(pIVar8,pIVar7->resultId);
    IVar10 = spv::Builder::makeUintType(this_00,8);
    pIVar9 = spv::Builder::addInstruction(this_00,IVar10,OpCompositeExtract);
    spv::Instruction::addIdOperand(pIVar9,pIVar8->resultId);
    spv::Instruction::addImmediateOperand(pIVar9,1);
    IVar10 = spv::Builder::makeUintType(this_00,8);
    pIVar8 = spv::Builder::addInstruction(this_00,IVar10,OpBitwiseAnd);
    local_b8 = pIVar8;
    spv::Instruction::addIdOperand(pIVar8,pIVar9->resultId);
    IVar10 = spv::Builder::makeUint8Constant(this_00,0x80,false);
    spv::Instruction::addIdOperand(pIVar8,IVar10);
    pIVar8 = spv::Builder::addInstruction(this_00,typeId_00,OpShiftLeftLogical);
    spv::Instruction::addIdOperand(pIVar8,pIVar7->resultId);
    IVar10 = spv::Builder::makeUint16Constant(this_00,1,false);
    spv::Instruction::addIdOperand(pIVar8,IVar10);
    pIVar7 = spv::Builder::addInstruction(this_00,typeId_00,OpISub);
    local_c8 = pIVar7;
    spv::Instruction::addIdOperand(pIVar7,pIVar8->resultId);
    IVar10 = spv::Builder::makeInt16Constant(this_00,0x4000,false);
    spv::Instruction::addIdOperand(pIVar7,IVar10);
    pIVar8 = spv::Builder::addInstruction(this_00,typeId_00,OpShiftRightArithmetic);
    spv::Instruction::addIdOperand(pIVar8,pIVar7->resultId);
    IVar10 = spv::Builder::makeInt16Constant(this_00,0xb,false);
    spv::Instruction::addIdOperand(pIVar8,IVar10);
    pIVar7 = spv::Builder::addInstruction(this_00,typeId_00,OpISub);
    spv::Instruction::addIdOperand(pIVar7,pIVar8->resultId);
    IVar10 = spv::Builder::makeInt16Constant(this_00,1,false);
    spv::Instruction::addIdOperand(pIVar7,IVar10);
    pIVar8 = spv::Builder::addInstruction(this_00,typeId_00,OpSNegate);
    spv::Instruction::addIdOperand(pIVar8,pIVar7->resultId);
    pIVar9 = spv::Builder::addInstruction(this_00,typeId_00,OpExtInst);
    spv::Instruction::addIdOperand(pIVar9,IVar2);
    spv::Instruction::addImmediateOperand(pIVar9,0x2a);
    local_c0 = pIVar9;
    spv::Instruction::addIdOperand(pIVar9,pIVar8->resultId);
    IVar2 = spv::Builder::makeInt16Constant(this_00,0,false);
    spv::Instruction::addIdOperand(pIVar9,IVar2);
    pIVar8 = spv::Builder::addInstruction(this_00,typeId_00,OpBitwiseAnd);
    spv::Instruction::addIdOperand(pIVar8,pIVar7->resultId);
    IVar2 = spv::Builder::makeInt16Constant(this_00,0x800,false);
    spv::Instruction::addIdOperand(pIVar8,IVar2);
    pIVar9 = spv::Builder::addInstruction(this_00,typeId_00,OpBitwiseAnd);
    spv::Instruction::addIdOperand(pIVar9,pIVar7->resultId);
    IVar2 = spv::Builder::makeInt16Constant(this_00,-0x800,false);
    spv::Instruction::addIdOperand(pIVar9,IVar2);
    pIVar7 = spv::Builder::addInstruction(this_00,typeId_00,OpBitwiseXor);
    spv::Instruction::addIdOperand(pIVar7,pIVar9->resultId);
    IVar2 = spv::Builder::makeInt16Constant(this_00,-1,false);
    spv::Instruction::addIdOperand(pIVar7,IVar2);
    pIVar9 = spv::Builder::addInstruction(this_00,typeId_00,OpBitwiseAnd);
    spv::Instruction::addIdOperand(pIVar9,local_c8->resultId);
    spv::Instruction::addIdOperand(pIVar9,pIVar7->resultId);
    pIVar7 = spv::Builder::addInstruction(this_00,typeId_00,OpBitwiseOr);
    spv::Instruction::addIdOperand(pIVar7,pIVar9->resultId);
    spv::Instruction::addIdOperand(pIVar7,pIVar8->resultId);
    pIVar8 = spv::Builder::addInstruction(this_00,typeId_00,OpBitwiseAnd);
    spv::Instruction::addIdOperand(pIVar8,pIVar7->resultId);
    IVar2 = spv::Builder::makeInt16Constant(this_00,0x7f,false);
    spv::Instruction::addIdOperand(pIVar8,IVar2);
    IVar2 = spv::Builder::makeIntType(this_00,8);
    pIVar9 = spv::Builder::addInstruction(this_00,IVar2,OpSConvert);
    spv::Instruction::addIdOperand(pIVar9,pIVar8->resultId);
    pIVar8 = spv::Builder::addInstruction(this_00,typeId_00,OpShiftRightArithmetic);
    spv::Instruction::addIdOperand(pIVar8,pIVar7->resultId);
    spv::Instruction::addIdOperand(pIVar8,local_c0->resultId);
    IVar2 = spv::Builder::makeIntType(this_00,8);
    IVar2 = spv::Builder::makeVectorType(this_00,IVar2,2);
    pIVar7 = spv::Builder::addInstruction(this_00,IVar2,OpBitcast);
    spv::Instruction::addIdOperand(pIVar7,pIVar8->resultId);
    IVar2 = spv::Builder::makeIntType(this_00,8);
    pIVar8 = spv::Builder::addInstruction(this_00,IVar2,OpCompositeExtract);
    spv::Instruction::addIdOperand(pIVar8,pIVar7->resultId);
    spv::Instruction::addImmediateOperand(pIVar8,0);
    IVar2 = spv::Builder::makeIntType(this_00,8);
    this_02 = spv::Builder::addInstruction(this_00,IVar2,OpBitwiseOr);
    spv::Instruction::addIdOperand(this_02,pIVar8->resultId);
    spv::Instruction::addIdOperand(this_02,pIVar9->resultId);
    IVar2 = spv::Builder::makeIntType(this_00,8);
    pIVar8 = spv::Builder::addInstruction(this_00,IVar2,OpCompositeExtract);
    spv::Instruction::addIdOperand(pIVar8,pIVar7->resultId);
    spv::Instruction::addImmediateOperand(pIVar8,1);
    IVar2 = spv::Builder::makeIntType(this_00,8);
    pIVar7 = spv::Builder::addInstruction(this_00,IVar2,OpBitwiseAnd);
    spv::Instruction::addIdOperand(pIVar7,pIVar8->resultId);
    IVar2 = spv::Builder::makeInt8Constant(this_00,'\x01',false);
    spv::Instruction::addIdOperand(pIVar7,IVar2);
    IVar2 = spv::Builder::makeIntType(this_00,8);
    pIVar9 = spv::Builder::addInstruction(this_00,IVar2,OpBitwiseOr);
    spv::Instruction::addIdOperand(pIVar9,pIVar7->resultId);
    spv::Instruction::addIdOperand(pIVar9,this_02->resultId);
    pIVar7 = spv::Builder::addInstruction(this_00,typeId,OpUGreaterThan);
    spv::Instruction::addIdOperand(pIVar7,pIVar9->resultId);
    IVar2 = spv::Builder::makeUint8Constant(this_00,0x80,false);
    spv::Instruction::addIdOperand(pIVar7,IVar2);
    IVar2 = spv::Builder::makeUintType(this_00,8);
    pIVar9 = spv::Builder::addInstruction(this_00,IVar2,OpSelect);
    spv::Instruction::addIdOperand(pIVar9,pIVar7->resultId);
    IVar2 = spv::Builder::makeUint8Constant(this_00,'\x01',false);
    spv::Instruction::addIdOperand(pIVar9,IVar2);
    IVar2 = spv::Builder::makeUint8Constant(this_00,'\0',false);
    spv::Instruction::addIdOperand(pIVar9,IVar2);
    IVar2 = spv::Builder::makeUintType(this_00,8);
    pIVar7 = spv::Builder::addInstruction(this_00,IVar2,OpIAdd);
    spv::Instruction::addIdOperand(pIVar7,pIVar8->resultId);
    spv::Instruction::addIdOperand(pIVar7,pIVar9->resultId);
    IVar2 = spv::Builder::makeUintType(this_00,8);
    pIVar8 = spv::Builder::addInstruction(this_00,IVar2,OpBitwiseAnd);
    spv::Instruction::addIdOperand(pIVar8,pIVar7->resultId);
    IVar2 = spv::Builder::makeUint8Constant(this_00,'\x7f',false);
    spv::Instruction::addIdOperand(pIVar8,IVar2);
    IVar2 = spv::Builder::makeUintType(this_00,8);
    pIVar7 = spv::Builder::addInstruction(this_00,IVar2,OpBitwiseOr);
    spv::Instruction::addIdOperand(pIVar7,pIVar8->resultId);
    spv::Instruction::addIdOperand(pIVar7,local_b8->resultId);
    IVar2 = spv::Builder::makeUintType(this_00,8);
    IVar2 = spv::Builder::makePointer(this_00,StorageClassFunction,IVar2);
    pIVar8 = spv::Builder::addInstruction(this_00,IVar2,OpInBoundsAccessChain);
    spv::Instruction::addIdOperand(pIVar8,id);
    spv::Instruction::addIdOperand(pIVar8,local_b0->resultId);
    pIVar9 = spv::Builder::addInstruction(this_00,OpStore);
    spv::Instruction::addIdOperand(pIVar9,pIVar8->resultId);
    spv::Instruction::addIdOperand(pIVar9,pIVar7->resultId);
    pIVar7 = spv::Builder::addInstruction(this_00,typeId,OpULessThan);
    spv::Instruction::addIdOperand(pIVar7,this_01->resultId);
    spv::Instruction::addIdOperand(pIVar7,local_88->resultId);
    elseBlock = local_98;
    pBVar6 = local_a8;
    spv::Builder::createLoopMerge(this_00,local_98,local_a8,0);
    spv::Builder::createConditionalBranch(this_00,pIVar7->resultId,pBVar6,elseBlock);
    pIVar1 = local_90;
    (local_90->builder).buildPoint = elseBlock;
    pIVar7 = spv::Builder::addInstruction(this_00,IVar3,OpLoad);
    spv::Instruction::addIdOperand(pIVar7,id);
    spv::Builder::makeReturn(this_00,false,pIVar7->resultId);
    pFVar5 = local_a0;
    (pIVar1->builder).buildPoint = local_80;
    local_68.output_type = IVar3;
    local_68.input_type = pointee;
    local_68.call = CoopMatFP16toFP8;
    local_68.func_id = (local_a0->functionInstruction).resultId;
    std::
    vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
    ::emplace_back<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>(local_78,&local_68);
    IVar3 = (pFVar5->functionInstruction).resultId;
  }
  return IVar3;
}

Assistant:

spv::Id SPIRVModule::Impl::build_coop_mat_fp16_to_fp8(SPIRVModule &module, const spv::Id *ids, uint32_t id_count)
{
	if (id_count != 2)
		return 0;

	spv::Id u8_type = ids[0];
	spv::Id f16_type = ids[1];

	for (auto &ops : coop_mat_conv_ids)
		if (ops.output_type == u8_type && ops.input_type == f16_type && ops.call == HelperCall::CoopMatFP16toFP8)
			return ops.func_id;

	auto *current_build_point = builder.getBuildPoint();

	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id bool_type = builder.makeBoolType();
	spv::Id s16_type = builder.makeIntType(16);

	// RADV workaround. It fails to understand coopmat passed as value.
	spv::Id f16_ptr_type = builder.makePointer(spv::StorageClassFunction, f16_type);

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, u8_type,
	                                       "CoopMatFP16toFP8",
	                                       { f16_ptr_type }, {}, &entry);

	spv::Id output_id = create_variable(spv::StorageClassFunction, u8_type, "coop_output");
	auto *len = builder.addInstruction(uint_type, spv::OpCooperativeMatrixLengthKHR);
	len->addIdOperand(u8_type);

	auto *header = new spv::Block(builder.getUniqueId(), *func);
	auto *merge = new spv::Block(builder.getUniqueId(), *func);
	builder.createBranch(header);
	builder.setBuildPoint(header);
	{
		auto *phi = builder.addInstruction(uint_type, spv::OpPhi);
		auto *iter = builder.addInstruction(uint_type, spv::OpIAdd);
		iter->addIdOperand(phi->getResultId());
		iter->addIdOperand(builder.makeUintConstant(1));

		phi->addIdOperand(builder.makeUintConstant(0));
		phi->addIdOperand(entry->getId());
		phi->addIdOperand(iter->getResultId());
		phi->addIdOperand(header->getId());

		auto *input_chain = builder.addInstruction(
			builder.makePointer(spv::StorageClassFunction, builder.makeFloatType(16)), spv::OpInBoundsAccessChain);
		input_chain->addIdOperand(func->getParamId(0));
		input_chain->addIdOperand(phi->getResultId());

		auto *load = builder.addInstruction(builder.makeFloatType(16), spv::OpLoad);
		load->addIdOperand(input_chain->getResultId());

		spv::Id glsl450 = builder.import("GLSL.std.450");
		auto *clamp = builder.addInstruction(builder.makeFloatType(16), spv::OpExtInst);
		clamp->addIdOperand(glsl450);
		clamp->addImmediateOperand(GLSLstd450NClamp);
		clamp->addIdOperand(load->getResultId());
		clamp->addIdOperand(builder.makeFloat16Constant(0x5f00 | 0x8000));
		clamp->addIdOperand(builder.makeFloat16Constant(0x5f00)); // 448.0.

		auto *bitcast = builder.addInstruction(s16_type, spv::OpBitcast);
		bitcast->addIdOperand(clamp->getResultId());

		// Extract the sign bit.
		auto *split_input = builder.addInstruction(builder.makeVectorType(builder.makeUintType(8), 2), spv::OpBitcast);
		split_input->addIdOperand(bitcast->getResultId());

		auto *extract_upper = builder.addInstruction(builder.makeUintType(8), spv::OpCompositeExtract);
		extract_upper->addIdOperand(split_input->getResultId());
		extract_upper->addImmediateOperand(1);

		auto *sign_bit = builder.addInstruction(builder.makeUintType(8), spv::OpBitwiseAnd);
		sign_bit->addIdOperand(extract_upper->getResultId());
		sign_bit->addIdOperand(builder.makeUint8Constant(0x80));
		///

		// When the input is shifted like this the result is E5M3 in upper byte, which is very handy.
		auto *unsigned_e5m11 = builder.addInstruction(s16_type, spv::OpShiftLeftLogical);
		unsigned_e5m11->addIdOperand(bitcast->getResultId());
		unsigned_e5m11->addIdOperand(builder.makeUint16Constant(1));

		// Shift -15 bias to -7 bias.
		auto *shift_exponent = builder.addInstruction(s16_type, spv::OpISub);
		shift_exponent->addIdOperand(unsigned_e5m11->getResultId());
		shift_exponent->addIdOperand(builder.makeInt16Constant(8 << 11));
		unsigned_e5m11 = shift_exponent;

		auto *exponent = builder.addInstruction(s16_type, spv::OpShiftRightArithmetic);
		exponent->addIdOperand(shift_exponent->getResultId());
		exponent->addIdOperand(builder.makeInt16Constant(11));

		auto *exponent_minus1 = builder.addInstruction(s16_type, spv::OpISub);
		exponent_minus1->addIdOperand(exponent->getResultId());
		exponent_minus1->addIdOperand(builder.makeInt16Constant(1));

		auto *denorm_shamt = builder.addInstruction(s16_type, spv::OpSNegate);
		denorm_shamt->addIdOperand(exponent_minus1->getResultId());

		// Ensure we don't get negative shift.
		clamp = builder.addInstruction(s16_type, spv::OpExtInst);
		clamp->addIdOperand(glsl450);
		clamp->addImmediateOperand(GLSLstd450SMax);
		clamp->addIdOperand(denorm_shamt->getResultId());
		clamp->addIdOperand(builder.makeInt16Constant(0));
		denorm_shamt = clamp;

		// If we're denorm, the arith shift ensures the upper bits are all 1.
		auto *denorm_mask = builder.addInstruction(s16_type, spv::OpBitwiseAnd);
		denorm_mask->addIdOperand(exponent_minus1->getResultId());
		denorm_mask->addIdOperand(builder.makeInt16Constant(1 << 11));

		// Serves as a clamping function.
		// If the exponent goes negative here, we need to emit a 0 exponent, marking that we're in denorm region.
		auto *clear_exponent_neg_mask = builder.addInstruction(s16_type, spv::OpBitwiseAnd);
		clear_exponent_neg_mask->addIdOperand(exponent_minus1->getResultId());
		clear_exponent_neg_mask->addIdOperand(builder.makeInt16Constant(int16_t(0x1f << 11)));
		auto *clear_exponent_mask = builder.addInstruction(s16_type, spv::OpBitwiseXor);
		clear_exponent_mask->addIdOperand(clear_exponent_neg_mask->getResultId());
		clear_exponent_mask->addIdOperand(builder.makeInt16Constant(-1));

		// Clamp negative exponent to 0.
		{
			auto *mask = builder.addInstruction(s16_type, spv::OpBitwiseAnd);
			mask->addIdOperand(unsigned_e5m11->getResultId());
			mask->addIdOperand(clear_exponent_mask->getResultId());
			unsigned_e5m11 = mask;
		}

		// If denorm, add in the implicit 1.xxxx.
		{
			auto *mask = builder.addInstruction(s16_type, spv::OpBitwiseOr);
			mask->addIdOperand(unsigned_e5m11->getResultId());
			mask->addIdOperand(denorm_mask->getResultId());
			unsigned_e5m11 = mask;
		}

		// Before we shift, we need to capture any possible rounding bits.
		// Only capture the lower 7 bits.
		// If we shift more than 7 we've already exhausted all denorm bits on E4M3 anyway, so don't need to care.
		// Cannot capture the top bit in lower half since we might get a false positive for 0.5 condition.
		auto *pre_denorm_rounding_bits = builder.addInstruction(s16_type, spv::OpBitwiseAnd);
		pre_denorm_rounding_bits->addIdOperand(unsigned_e5m11->getResultId());
		pre_denorm_rounding_bits->addIdOperand(builder.makeInt16Constant(0x7f));
		auto *trunc = builder.addInstruction(builder.makeIntType(8), spv::OpSConvert);
		trunc->addIdOperand(pre_denorm_rounding_bits->getResultId());
		pre_denorm_rounding_bits = trunc;

		// Now we apply the denorm shift.
		auto *denorm_shift = builder.addInstruction(s16_type, spv::OpShiftRightArithmetic);
		denorm_shift->addIdOperand(unsigned_e5m11->getResultId());
		denorm_shift->addIdOperand(denorm_shamt->getResultId());
		unsigned_e5m11 = denorm_shift;

		// Capture any rounding bits.
		// If we shift due to denorms,
		// we have to know if we shifted away bits that are relevant to RTE.
		auto *split = builder.addInstruction(builder.makeVectorType(builder.makeIntType(8), 2), spv::OpBitcast);
		split->addIdOperand(unsigned_e5m11->getResultId());

		auto *rounding_bits = builder.addInstruction(builder.makeIntType(8), spv::OpCompositeExtract);
		rounding_bits->addIdOperand(split->getResultId());
		rounding_bits->addImmediateOperand(0);

		auto *rounding_bits_or = builder.addInstruction(builder.makeIntType(8), spv::OpBitwiseOr);
		rounding_bits_or->addIdOperand(rounding_bits->getResultId());
		rounding_bits_or->addIdOperand(pre_denorm_rounding_bits->getResultId());
		rounding_bits = rounding_bits_or;

		auto *unsigned_e5m3 = builder.addInstruction(builder.makeIntType(8), spv::OpCompositeExtract);
		unsigned_e5m3->addIdOperand(split->getResultId());
		unsigned_e5m3->addImmediateOperand(1);

		auto *is_odd = builder.addInstruction(builder.makeIntType(8), spv::OpBitwiseAnd);
		is_odd->addIdOperand(unsigned_e5m3->getResultId());
		is_odd->addIdOperand(builder.makeInt8Constant(1));

		auto *or_rounding_bits = builder.addInstruction(builder.makeIntType(8), spv::OpBitwiseOr);
		or_rounding_bits->addIdOperand(is_odd->getResultId());
		or_rounding_bits->addIdOperand(rounding_bits->getResultId());

		// To get > 0x80 in lower bits either the fraction is > 0.5, or it's exactly 0.5 and the upper part is odd,
		// which would make the result 0x81.
		auto *should_round = builder.addInstruction(bool_type, spv::OpUGreaterThan);
		should_round->addIdOperand(or_rounding_bits->getResultId());
		should_round->addIdOperand(builder.makeUint8Constant(0x80));

		// Compensate for exponent bias when dealing with denorms.
		auto *rounding = builder.addInstruction(builder.makeUintType(8), spv::OpSelect);
		rounding->addIdOperand(should_round->getResultId());
		rounding->addIdOperand(builder.makeUint8Constant(1));
		rounding->addIdOperand(builder.makeUint8Constant(0));

		// Add rounding.
		auto *add_rounding = builder.addInstruction(builder.makeUintType(8), spv::OpIAdd);
		add_rounding->addIdOperand(unsigned_e5m3->getResultId());
		add_rounding->addIdOperand(rounding->getResultId());

		// Mask away the top exponent. We should be in range now anyway.
		auto *e4m3 = builder.addInstruction(builder.makeUintType(8), spv::OpBitwiseAnd);
		e4m3->addIdOperand(add_rounding->getResultId());
		e4m3->addIdOperand(builder.makeUint8Constant(0x7f));

		// OR in the sign bit.
		auto *with_sign = builder.addInstruction(builder.makeUintType(8), spv::OpBitwiseOr);
		with_sign->addIdOperand(e4m3->getResultId());
		with_sign->addIdOperand(sign_bit->getResultId());

		auto *output_chain = builder.addInstruction(
			builder.makePointer(spv::StorageClassFunction, builder.makeUintType(8)), spv::OpInBoundsAccessChain);
		output_chain->addIdOperand(output_id);
		output_chain->addIdOperand(phi->getResultId());
		auto *store = builder.addInstruction(spv::OpStore);
		store->addIdOperand(output_chain->getResultId());
		store->addIdOperand(with_sign->getResultId());

		auto *cmp = builder.addInstruction(bool_type, spv::OpULessThan);
		cmp->addIdOperand(iter->getResultId());
		cmp->addIdOperand(len->getResultId());
		builder.createLoopMerge(merge, header, 0);
		builder.createConditionalBranch(cmp->getResultId(), header, merge);
	}

	builder.setBuildPoint(merge);
	auto *loaded_result = builder.addInstruction(u8_type, spv::OpLoad);
	loaded_result->addIdOperand(output_id);
	builder.makeReturn(false, loaded_result->getResultId());
	builder.setBuildPoint(current_build_point);
	coop_mat_conv_ids.push_back({ f16_type, u8_type, func->getId(), HelperCall::CoopMatFP16toFP8 });
	return func->getId();
}